

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O2

void __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>
          (packer<msgpack::v1::sbuffer> *this,long d)

{
  ushort uVar1;
  uint uVar2;
  size_t sStack_20;
  char buf [9];
  
  if (d < -0x20) {
    if (0xffffffffffff7fff < (ulong)d) {
      if (0xffffffffffffff7f < (ulong)d) {
        buf[0] = -0x30;
LAB_00163949:
        buf[1] = (char)d;
        sStack_20 = 2;
        goto LAB_0016398b;
      }
      buf[0] = -0x2f;
LAB_0016396e:
      uVar1 = (ushort)d << 8 | (ushort)d >> 8;
      buf[1] = (char)uVar1;
      buf[2] = (char)(uVar1 >> 8);
      sStack_20 = 3;
      goto LAB_0016398b;
    }
    if (0xffffffff7fffffff < (ulong)d) {
      buf[0] = -0x2e;
LAB_00163962:
      uVar2 = (uint)d;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      buf[1] = (char)uVar2;
      buf[2] = (char)(uVar2 >> 8);
      buf[3] = (char)(uVar2 >> 0x10);
      buf[4] = (char)(uVar2 >> 0x18);
      sStack_20 = 5;
      goto LAB_0016398b;
    }
    buf[0] = -0x2d;
  }
  else {
    if (d < 0x80) {
      sStack_20 = 1;
      buf[0] = (char)d;
      goto LAB_0016398b;
    }
    if ((ulong)d < 0x10000) {
      if ((ulong)d < 0x100) {
        buf[0] = -0x34;
        goto LAB_00163949;
      }
      buf[0] = -0x33;
      goto LAB_0016396e;
    }
    if ((ulong)d >> 0x20 == 0) {
      buf[0] = -0x32;
      goto LAB_00163962;
    }
    buf[0] = -0x31;
  }
  buf._1_8_ = (ulong)d >> 0x38 | (d & 0xff000000000000U) >> 0x28 | (d & 0xff0000000000U) >> 0x18 |
              (d & 0xff00000000U) >> 8 | (d & 0xff000000U) << 8 | (d & 0xff0000U) << 0x18 |
              (d & 0xff00U) << 0x28 | d << 0x38;
  sStack_20 = 9;
LAB_0016398b:
  append_buffer(this,buf,sStack_20);
  return;
}

Assistant:

inline void packer<Stream>::pack_imp_int64(T d)
{
    if(d < -(1LL<<5)) {
        if(d < -(1LL<<15)) {
            if(d < -(1LL<<31)) {
                /* signed 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xd3u); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            } else {
                /* signed 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xd2u); _msgpack_store32(&buf[1], static_cast<int32_t>(d));
                append_buffer(buf, 5);
            }
        } else {
            if(d < -(1<<7)) {
                /* signed 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xd1u); _msgpack_store16(&buf[1], static_cast<int16_t>(d));
                append_buffer(buf, 3);
            } else {
                /* signed 8 */
                char buf[2] = {static_cast<char>(0xd0u), take8_64(d)};
                append_buffer(buf, 2);
            }
        }
    } else if(d < (1<<7)) {
        /* fixnum */
        char buf = take8_64(d);
        append_buffer(&buf, 1);
    } else {
        if(d < (1LL<<16)) {
            if(d < (1<<8)) {
                /* unsigned 8 */
                char buf[2] = {static_cast<char>(0xccu), take8_64(d)};
                append_buffer(buf, 2);
            } else {
                /* unsigned 16 */
                char buf[3];
                buf[0] = static_cast<char>(0xcdu); _msgpack_store16(&buf[1], static_cast<uint16_t>(d));
                append_buffer(buf, 3);
            }
        } else {
            if(d < (1LL<<32)) {
                /* unsigned 32 */
                char buf[5];
                buf[0] = static_cast<char>(0xceu); _msgpack_store32(&buf[1], static_cast<uint32_t>(d));
                append_buffer(buf, 5);
            } else {
                /* unsigned 64 */
                char buf[9];
                buf[0] = static_cast<char>(0xcfu); _msgpack_store64(&buf[1], d);
                append_buffer(buf, 9);
            }
        }
    }
}